

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

P<r_code::Code> * __thiscall
r_code::vector<core::P<r_code::Code>_>::operator[](vector<core::P<r_code::Code>_> *this,size_t i)

{
  size_t sVar1;
  reference pvVar2;
  size_t i_local;
  vector<core::P<r_code::Code>_> *this_local;
  
  sVar1 = size(this);
  if (sVar1 <= i) {
    std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::resize
              (&this->m_vector,i + 1);
  }
  pvVar2 = std::vector<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>::at
                     (&this->m_vector,i);
  return pvVar2;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }